

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChValueSpecific<unsigned_long_long>::CallOut
          (ChValueSpecific<unsigned_long_long> *this,ChArchiveOut *marchive)

{
  unsigned_long_long *t;
  char *custom_name;
  ChNameValue<unsigned_long_long> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  ChValueSpecific<unsigned_long_long> *this_local;
  
  t = this->_ptr_to_val;
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  custom_name = (char *)std::__cxx11::string::c_str();
  make_ChNameValue<unsigned_long_long>(&local_30,"*this->_ptr_to_val",t,custom_name,'\0');
  (*(marchive->super_ChArchive)._vptr_ChArchive[10])(marchive,&local_30);
  ChNameValue<unsigned_long_long>::~ChNameValue(&local_30);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}